

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

LoopEvent rec_iterl(jit_State *J,BCIns iterins)

{
  uint uVar1;
  uint uVar2;
  uint in_ESI;
  long in_RDI;
  BCReg ra;
  int32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  uVar1 = in_ESI >> 8 & 0xff;
  if (*(int *)(*(long *)(in_RDI + 0x88) + (ulong)uVar1 * 4) == 0) {
    uVar2 = sload((jit_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc);
  }
  else {
    uVar2 = *(uint *)(*(long *)(in_RDI + 0x88) + (ulong)uVar1 * 4);
  }
  if ((uVar2 & 0x1f000000) == 0) {
    *(uint *)(in_RDI + 0x94) = uVar1 - 3;
    *(long *)(in_RDI + 0x70) = *(long *)(in_RDI + 0x70) + 4;
    local_4 = LOOPEV_LEAVE;
  }
  else {
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + (ulong)(uVar1 - 1) * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x88) + (ulong)uVar1 * 4);
    *(uint *)(in_RDI + 0x94) = (uVar1 - 1) + (*(uint *)(*(long *)(in_RDI + 0x70) + -4) >> 0x18);
    *(ulong *)(in_RDI + 0x70) = ((ulong)(in_ESI >> 0x10) - 0x7fff) * 4 + *(long *)(in_RDI + 0x70);
    local_4 = LOOPEV_ENTER;
  }
  return local_4;
}

Assistant:

static LoopEvent rec_iterl(jit_State *J, const BCIns iterins)
{
  BCReg ra = bc_a(iterins);
  if (!tref_isnil(getslot(J, ra))) {  /* Looping back? */
    J->base[ra-1] = J->base[ra];  /* Copy result of ITERC to control var. */
    J->maxslot = ra-1+bc_b(J->pc[-1]);
    J->pc += bc_j(iterins)+1;
    return LOOPEV_ENTER;
  } else {
    J->maxslot = ra-3;
    J->pc++;
    return LOOPEV_LEAVE;
  }
}